

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<double>_>::MultAdd
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  long lVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  double dVar5;
  long lVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  complex<double> *pcVar10;
  int iVar11;
  ulong uVar12;
  int opt_00;
  complex<double> *pcVar13;
  undefined1 (*pauVar14) [16];
  complex<double> *pcVar15;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  double dVar16;
  complex<double> beta_00;
  double local_e8;
  double dStack_e0;
  TPZSkylMatrix<std::complex<double>_> *local_d8;
  long local_d0;
  undefined1 local_c8 [24];
  long local_b0;
  long local_a8;
  long local_a0;
  TPZFMatrix<std::complex<double>_> *local_98;
  double local_90;
  double dStack_88;
  long local_80;
  TPZFMatrix<std::complex<double>_> *local_78;
  long local_70;
  long local_68;
  long local_60;
  complex<double> local_58;
  double local_48;
  double dStack_40;
  
  opt_00 = alpha._M_value._8_4_;
  uVar12 = alpha._M_value._0_8_;
  iVar11 = alpha._M_value._0_4_;
  uVar9 = uVar12 & 0xffffffff;
  local_90 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_d8 = this;
  dStack_88 = in_XMM1_Qa;
  if (((iVar11 == 0) &&
      ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
       (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
      (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<double>]"
               ," <matrixs with incompatible dimensions>");
  }
  lVar1 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  if (((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow != lVar1) ||
     ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol !=
      (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    (*(z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])
              (z,lVar1,(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
  }
  lVar1 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if (((lVar1 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
      (lVar1 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) ||
     ((lVar1 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow,
      lVar1 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow ||
      (lVar1 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," y.Cols()",9);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," z.Cols() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," x.Rows() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," y.Rows() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," z.Rows() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    TPZMatrix<std::complex<double>_>::Error
              ("virtual void TPZSkylMatrix<std::complex<double>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<double>]"
               ," incompatible dimensions\n");
  }
  beta_00._M_value._8_8_ = uVar12;
  beta_00._M_value._0_8_ = uVar9;
  local_78 = z;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&local_d8->super_TPZMatrix<std::complex<double>_>,y,z,beta_00,opt_00);
  local_80 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if (0 < local_80) {
    local_a8 = (local_d8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
    local_a0 = 0;
    local_98 = x;
    do {
      if (0 < local_a8) {
        local_d0 = 0;
        do {
          lVar1 = local_a0;
          ppcVar2 = (local_d8->fElem).fStore;
          local_b0 = (long)ppcVar2[local_d0 + 1] - (long)ppcVar2[local_d0];
          local_60 = local_b0 >> 4;
          local_c8._0_16_ = ZEXT816(0);
          local_68 = (local_d0 - local_60) + 1;
          local_70 = local_68 * 0x10;
          pcVar15 = x->fElem +
                    (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow * local_a0
                    + local_68;
          pcVar3 = (local_d8->fElem).fStore[local_d0];
          pcVar10 = (complex<double> *)(local_b0 + (long)pcVar3);
          while (pcVar13 = pcVar10 + -1, pcVar3 < pcVar13) {
            if (iVar11 == 0) {
              local_e8 = *(double *)pcVar13->_M_value;
              dStack_e0 = -*(double *)(pcVar10[-1]._M_value + 8);
            }
            else {
              local_e8 = *(double *)pcVar13->_M_value;
              dStack_e0 = *(double *)(pcVar10[-1]._M_value + 8);
            }
            std::complex<double>::operator*=((complex<double> *)&local_e8,pcVar15);
            dStack_e0 = dStack_e0 + (double)local_c8._8_8_;
            local_c8._8_4_ = SUB84(dStack_e0,0);
            local_c8._0_8_ = local_e8 + (double)local_c8._0_8_;
            local_c8._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
            pcVar15 = pcVar15 + 1;
            pcVar10 = pcVar13;
          }
          if (pcVar13 == pcVar3) {
            local_e8 = *(double *)pcVar13->_M_value;
            dStack_e0 = *(double *)(pcVar10[-1]._M_value + 8);
            std::complex<double>::operator*=((complex<double> *)&local_e8,pcVar15);
            dStack_e0 = dStack_e0 + (double)local_c8._8_8_;
            local_c8._8_4_ = SUB84(dStack_e0,0);
            local_c8._0_8_ = local_e8 + (double)local_c8._0_8_;
            local_c8._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
          }
          local_e8 = (double)local_c8._0_8_;
          dStack_e0 = (double)local_c8._8_8_;
          std::complex<double>::operator*=
                    ((complex<double> *)&local_e8,(complex<double> *)&local_90);
          lVar6 = local_d0;
          if (((local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
               local_d0) ||
             ((local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar1))
          {
            local_48 = local_e8;
            dStack_40 = dStack_e0;
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = (local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow *
                  lVar1;
          pcVar10 = local_78->fElem + lVar8 + local_d0;
          dVar5 = *(double *)(pcVar10->_M_value + 8);
          dVar16 = local_e8 + *(double *)pcVar10->_M_value;
          pcVar10 = local_78->fElem + lVar8 + local_d0;
          *(double *)pcVar10->_M_value = dVar16;
          *(double *)(pcVar10->_M_value + 8) = dStack_e0 + dVar5;
          if (((local_d0 - local_60 < -1) ||
              ((local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <=
               local_68)) ||
             ((local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar1))
          {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = (local_78->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          pcVar10 = local_78->fElem;
          (*(local_98->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(local_98,local_d0,lVar1);
          local_c8._4_4_ = extraout_XMM0_Db;
          local_c8._0_4_ = extraout_XMM0_Da;
          local_c8._8_8_ = dVar16;
          pcVar15 = (complex<double> *)((local_d8->fElem).fStore[lVar6][-1]._M_value + local_b0);
          if (pcVar3 < pcVar15) {
            pauVar14 = (undefined1 (*) [16])(pcVar10[lVar8 * local_a0]._M_value + local_70);
            do {
              pcVar10 = pcVar15;
              if (iVar11 != 0) {
                local_58._M_value._0_8_ = *(undefined8 *)pcVar15->_M_value;
                local_58._M_value._8_8_ = *(ulong *)(pcVar15->_M_value + 8) ^ 0x8000000000000000;
                pcVar10 = &local_58;
              }
              dStack_e0 = dStack_88;
              local_e8 = local_90;
              std::complex<double>::operator*=((complex<double> *)&local_e8,pcVar10);
              std::complex<double>::operator*=
                        ((complex<double> *)&local_e8,(complex<double> *)local_c8);
              dStack_e0 = *(double *)(*pauVar14 + 8) + dStack_e0;
              auVar4._8_4_ = SUB84(dStack_e0,0);
              auVar4._0_8_ = *(double *)*pauVar14 + local_e8;
              auVar4._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
              *pauVar14 = auVar4;
              pauVar14 = pauVar14 + 1;
              pcVar15 = pcVar15 + -1;
            } while (pcVar3 < pcVar15);
          }
          local_d0 = local_d0 + 1;
          x = local_98;
        } while (local_d0 != local_a8);
      }
      local_a0 = local_a0 + 1;
    } while (local_a0 != local_80);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}